

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-expr-visitor.h
# Opt level: O1

double __thiscall
mp::BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
::Visit(BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
        *this,Expr e)

{
  uint uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  long lVar4;
  double dVar5;
  
  dVar5 = 0.0;
  switch(*(undefined4 *)e.super_ExprBase.impl_) {
  case 2:
    pp_Var2 = this[2]._vptr_BasicExprVisitor;
    uVar1 = *(uint *)(pp_Var2[0x27] + (long)*(int *)((long)e.super_ExprBase.impl_ + 4) * 4);
    if ((int)uVar1 < 0) {
      p_Var3 = pp_Var2[0x1e];
      lVar4 = (long)*(int *)(pp_Var2[0x21] + (ulong)~uVar1 * 0xc + 4) * 0x30;
      dVar5 = *(double *)
               (*(long *)(p_Var3 + lVar4 + 0x18) +
               ((long)(int)((ulong)(*(long *)(p_Var3 + lVar4 + 8) - *(long *)(p_Var3 + lVar4)) >> 3)
                * (long)*(int *)(pp_Var2[0x21] + (ulong)~uVar1 * 0xc + 8) +
               (long)*(int *)&this[1]._vptr_BasicExprVisitor) * 8);
    }
    if (-1 < (int)uVar1) {
      VisitUnsupported((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)e.super_ExprBase.impl_,(Expr)e.super_ExprBase.impl_);
    }
    break;
  case 3:
    VisitCommonExpr((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                     *)e.super_ExprBase.impl_,(CommonExpr)e.super_ExprBase.impl_);
  case 0x47:
    VisitSymbolicIf((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                     *)e.super_ExprBase.impl_,(SymbolicIfExpr)e.super_ExprBase.impl_);
  case 0x46:
    VisitStringLiteral((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)e.super_ExprBase.impl_,(StringLiteral)e.super_ExprBase.impl_);
  case 0x45:
    VisitNotAllDiff((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                     *)e.super_ExprBase.impl_,(PairwiseExpr)e.super_ExprBase.impl_);
  case 0x44:
    VisitAllDiff((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                  *)e.super_ExprBase.impl_,(PairwiseExpr)e.super_ExprBase.impl_);
  case 0x43:
    VisitForAll((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                 *)e.super_ExprBase.impl_,(IteratedLogicalExpr)e.super_ExprBase.impl_);
  case 0x42:
    VisitExists((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                 *)e.super_ExprBase.impl_,(IteratedLogicalExpr)e.super_ExprBase.impl_);
  case 0x41:
    VisitImplication((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                      *)e.super_ExprBase.impl_,(ImplicationExpr)e.super_ExprBase.impl_);
  case 0x40:
    VisitNotExactly((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                     *)e.super_ExprBase.impl_,(LogicalCountExpr)e.super_ExprBase.impl_);
  case 0x3f:
    VisitNotAtMost((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                    *)e.super_ExprBase.impl_,(LogicalCountExpr)e.super_ExprBase.impl_);
  case 0x3e:
    VisitNotAtLeast((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                     *)e.super_ExprBase.impl_,(LogicalCountExpr)e.super_ExprBase.impl_);
  case 0x3d:
    VisitExactly((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                  *)e.super_ExprBase.impl_,(LogicalCountExpr)e.super_ExprBase.impl_);
  case 0x3c:
    VisitAtMost((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                 *)e.super_ExprBase.impl_,(LogicalCountExpr)e.super_ExprBase.impl_);
  case 0x3b:
    VisitAtLeast((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                  *)e.super_ExprBase.impl_,(LogicalCountExpr)e.super_ExprBase.impl_);
  case 0x3a:
    VisitNE((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
             *)e.super_ExprBase.impl_,(RelationalExpr)e.super_ExprBase.impl_);
  case 0x39:
    VisitGT((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
             *)e.super_ExprBase.impl_,(RelationalExpr)e.super_ExprBase.impl_);
  case 0x38:
    VisitGE((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
             *)e.super_ExprBase.impl_,(RelationalExpr)e.super_ExprBase.impl_);
  case 0x37:
    VisitEQ((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
             *)e.super_ExprBase.impl_,(RelationalExpr)e.super_ExprBase.impl_);
  case 0x36:
    VisitLE((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
             *)e.super_ExprBase.impl_,(RelationalExpr)e.super_ExprBase.impl_);
  case 0x35:
    VisitLT((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
             *)e.super_ExprBase.impl_,(RelationalExpr)e.super_ExprBase.impl_);
  case 0x34:
    VisitIff((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
              *)e.super_ExprBase.impl_,(BinaryLogicalExpr)e.super_ExprBase.impl_);
  case 0x33:
    VisitAnd((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
              *)e.super_ExprBase.impl_,(BinaryLogicalExpr)e.super_ExprBase.impl_);
  case 0x32:
    VisitOr((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
             *)e.super_ExprBase.impl_,(BinaryLogicalExpr)e.super_ExprBase.impl_);
  case 0x31:
    VisitNot((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
              *)e.super_ExprBase.impl_,(NotExpr)e.super_ExprBase.impl_);
  case 0x30:
    VisitLogicalConstant
              ((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                *)e.super_ExprBase.impl_,(LogicalConstant)e.super_ExprBase.impl_);
  case 0x2f:
    VisitCount((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                *)e.super_ExprBase.impl_,(CountExpr)e.super_ExprBase.impl_);
  case 0x2e:
    VisitNumberOfSym((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                      *)e.super_ExprBase.impl_,(SymbolicNumberOfExpr)e.super_ExprBase.impl_);
  case 0x2d:
    VisitNumberOf((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                   *)e.super_ExprBase.impl_,(NumberOfExpr)e.super_ExprBase.impl_);
  case 0x2c:
    VisitSum((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
              *)e.super_ExprBase.impl_,(SumExpr)e.super_ExprBase.impl_);
  case 0x2b:
    VisitMax((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
              *)e.super_ExprBase.impl_,(VarArgExpr)e.super_ExprBase.impl_);
  case 0x2a:
    VisitMin((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
              *)e.super_ExprBase.impl_,(VarArgExpr)e.super_ExprBase.impl_);
  case 0x29:
    VisitCall((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
               *)e.super_ExprBase.impl_,(CallExpr)e.super_ExprBase.impl_);
  case 0x28:
    VisitPLTerm((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                 *)e.super_ExprBase.impl_,(PLTerm)e.super_ExprBase.impl_);
  case 0x27:
    VisitIf((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
             *)e.super_ExprBase.impl_,(IfExpr)e.super_ExprBase.impl_);
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
    dVar5 = internal::BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>::
            VisitUnary((BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>
                        *)this,(UnaryExpr)e.super_ExprBase.impl_);
    return dVar5;
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
    internal::BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>::
    VisitBinary((BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector> *)this
                ,(BinaryExpr)e.super_ExprBase.impl_);
    dVar5 = 0.0;
  }
  return dVar5;
}

Assistant:

Result BasicExprVisitor<Impl, Result, ET>::Visit(Expr e) {
  // All expressions except OPNUMBEROFs and OPIFSYM are supported.
  switch (e.kind()) {
  default:
    MP_ASSERT(false, "invalid expression");
    // Fall through.
  case expr::NUMBER:
    return MP_DISPATCH(VisitNumericConstant(
                         ET::template UncheckedCast<NumericConstant>(e)));
  case expr::VARIABLE:
    return MP_DISPATCH(VisitVariable(ET::template UncheckedCast<Variable>(e)));
  case expr::COMMON_EXPR:
    return MP_DISPATCH(VisitCommonExpr(
                         ET::template UncheckedCast<CommonExpr>(e)));

  // Unary expressions.
  case expr::MINUS:
    return MP_DISPATCH(VisitMinus(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ABS:
    return MP_DISPATCH(VisitAbs(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::FLOOR:
    return MP_DISPATCH(VisitFloor(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::CEIL:
    return MP_DISPATCH(VisitCeil(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::SQRT:
    return MP_DISPATCH(VisitSqrt(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::POW2:
    return MP_DISPATCH(VisitPow2(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::EXP:
    return MP_DISPATCH(VisitExp(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::LOG:
    return MP_DISPATCH(VisitLog(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::LOG10:
    return MP_DISPATCH(VisitLog10(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::SIN:
    return MP_DISPATCH(VisitSin(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::SINH:
    return MP_DISPATCH(VisitSinh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::COS:
    return MP_DISPATCH(VisitCos(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::COSH:
    return MP_DISPATCH(VisitCosh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::TAN:
    return MP_DISPATCH(VisitTan(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::TANH:
    return MP_DISPATCH(VisitTanh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ASIN:
    return MP_DISPATCH(VisitAsin(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ASINH:
    return MP_DISPATCH(VisitAsinh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ACOS:
    return MP_DISPATCH(VisitAcos(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ACOSH:
    return MP_DISPATCH(VisitAcosh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ATAN:
    return MP_DISPATCH(VisitAtan(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ATANH:
    return MP_DISPATCH(VisitAtanh(ET::template UncheckedCast<UnaryExpr>(e)));

  // Binary expressions.
  case expr::ADD:
    return MP_DISPATCH(VisitAdd(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::SUB:
    return MP_DISPATCH(VisitSub(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::LESS:
    return MP_DISPATCH(VisitLess(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::MUL:
    return MP_DISPATCH(VisitMul(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::DIV:
    return MP_DISPATCH(VisitDiv(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::TRUNC_DIV:
    return MP_DISPATCH(VisitTruncDiv(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::MOD:
    return MP_DISPATCH(VisitMod(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::POW:
    return MP_DISPATCH(VisitPow(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::POW_CONST_BASE:
    return MP_DISPATCH(VisitPowConstBase(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::POW_CONST_EXP:
    return MP_DISPATCH(VisitPowConstExp(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::ATAN2:
    return MP_DISPATCH(VisitAtan2(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::PRECISION:
    return MP_DISPATCH(VisitPrecision(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::ROUND:
    return MP_DISPATCH(VisitRound(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::TRUNC:
    return MP_DISPATCH(VisitTrunc(ET::template UncheckedCast<BinaryExpr>(e)));

  case expr::IF:
    return MP_DISPATCH(VisitIf(ET::template UncheckedCast<IfExpr>(e)));
  case expr::PLTERM:
    return MP_DISPATCH(VisitPLTerm(ET::template UncheckedCast<PLTerm>(e)));
  case expr::CALL:
    return MP_DISPATCH(VisitCall(ET::template UncheckedCast<CallExpr>(e)));
  case expr::MIN:
    return MP_DISPATCH(VisitMin(ET::template UncheckedCast<VarArgExpr>(e)));
  case expr::MAX:
    return MP_DISPATCH(VisitMax(ET::template UncheckedCast<VarArgExpr>(e)));
  case expr::SUM:
    return MP_DISPATCH(VisitSum(ET::template UncheckedCast<SumExpr>(e)));
  case expr::NUMBEROF:
    return MP_DISPATCH(VisitNumberOf(
                         ET::template UncheckedCast<NumberOfExpr>(e)));
  case expr::NUMBEROF_SYM:
    return MP_DISPATCH(VisitNumberOfSym(
                         ET::template UncheckedCast<SymbolicNumberOfExpr>(e)));
  case expr::COUNT:
    return MP_DISPATCH(VisitCount(ET::template UncheckedCast<CountExpr>(e)));

    // Logical expressions.
  case expr::BOOL:
    return MP_DISPATCH(VisitLogicalConstant(
                         ET::template UncheckedCast<LogicalConstant>(e)));
  case expr::NOT:
    return MP_DISPATCH(VisitNot(ET::template UncheckedCast<NotExpr>(e)));
  case expr::OR:
    return MP_DISPATCH(VisitOr(
                         ET::template UncheckedCast<BinaryLogicalExpr>(e)));
  case expr::AND:
    return MP_DISPATCH(VisitAnd(
                         ET::template UncheckedCast<BinaryLogicalExpr>(e)));
  case expr::IFF:
    return MP_DISPATCH(VisitIff(
                         ET::template UncheckedCast<BinaryLogicalExpr>(e)));
  case expr::LT:
    return MP_DISPATCH(VisitLT(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::LE:
    return MP_DISPATCH(VisitLE(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::EQ:
    return MP_DISPATCH(VisitEQ(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::GE:
    return MP_DISPATCH(VisitGE(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::GT:
    return MP_DISPATCH(VisitGT(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::NE:
    return MP_DISPATCH(VisitNE(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::ATLEAST:
    return MP_DISPATCH(VisitAtLeast(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::ATMOST:
    return MP_DISPATCH(VisitAtMost(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::EXACTLY:
    return MP_DISPATCH(VisitExactly(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::NOT_ATLEAST:
    return MP_DISPATCH(VisitNotAtLeast(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::NOT_ATMOST:
    return MP_DISPATCH(VisitNotAtMost(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::NOT_EXACTLY:
    return MP_DISPATCH(VisitNotExactly(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::IMPLICATION:
    return MP_DISPATCH(VisitImplication(
                         ET::template UncheckedCast<ImplicationExpr>(e)));
  case expr::EXISTS:
    return MP_DISPATCH(VisitExists(
                         ET::template UncheckedCast<IteratedLogicalExpr>(e)));
  case expr::FORALL:
    return MP_DISPATCH(VisitForAll(
                         ET::template UncheckedCast<IteratedLogicalExpr>(e)));
  case expr::ALLDIFF:
    return MP_DISPATCH(VisitAllDiff(
                         ET::template UncheckedCast<PairwiseExpr>(e)));
  case expr::NOT_ALLDIFF:
    return MP_DISPATCH(VisitNotAllDiff(
                         ET::template UncheckedCast<PairwiseExpr>(e)));

    // String expressions.
  case expr::STRING:
    return MP_DISPATCH(VisitStringLiteral(
                         ET::template UncheckedCast<StringLiteral>(e)));
  case expr::IFSYM:
    return MP_DISPATCH(VisitSymbolicIf(
                         ET::template UncheckedCast<SymbolicIfExpr>(e)));
  }
}